

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int btreeInitPage(MemPage *pPage)

{
  byte bVar1;
  u32 uVar2;
  BtShared *pBVar3;
  u8 *puVar4;
  int iVar5;
  ushort uVar6;
  undefined8 uVar7;
  ulong uVar8;
  
  pBVar3 = pPage->pBt;
  puVar4 = pPage->aData;
  uVar8 = (ulong)pPage->hdrOffset;
  iVar5 = decodeFlags(pPage,(uint)puVar4[uVar8]);
  if (iVar5 == 0) {
    uVar2 = pBVar3->pageSize;
    pPage->maskPage = (short)uVar2 - 1;
    pPage->nOverflow = '\0';
    bVar1 = pPage->childPtrSize;
    pPage->cellOffset = pPage->hdrOffset + 8 + (ushort)bVar1;
    pPage->aCellIdx = puVar4 + (ulong)bVar1 + uVar8 + 8;
    pPage->aDataEnd = pPage->aData + pBVar3->usableSize;
    pPage->aDataOfst = pPage->aData + bVar1;
    uVar6 = *(ushort *)(puVar4 + uVar8 + 3) << 8 | *(ushort *)(puVar4 + uVar8 + 3) >> 8;
    pPage->nCell = uVar6;
    if ((uint)uVar6 <= (uVar2 - 8) / 6) {
      pPage->nFree = -1;
      pPage->isInit = '\x01';
      if ((pBVar3->db->flags & 0x200000) == 0) {
        return 0;
      }
      iVar5 = btreeCellSizeCheck(pPage);
      return iVar5;
    }
    uVar7 = 0xfeaf;
  }
  else {
    uVar7 = 0xfea1;
  }
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar7,
              "884b4b7e502b4e991677b53971277adfaf0a04a284f8e483e2553d0f83156b50");
  return 0xb;
}

Assistant:

static int btreeInitPage(MemPage *pPage){
  u8 *data;          /* Equal to pPage->aData */
  BtShared *pBt;        /* The main btree structure */

  assert( pPage->pBt!=0 );
  assert( pPage->pBt->db!=0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->pgno==sqlite3PagerPagenumber(pPage->pDbPage) );
  assert( pPage == sqlite3PagerGetExtra(pPage->pDbPage) );
  assert( pPage->aData == sqlite3PagerGetData(pPage->pDbPage) );
  assert( pPage->isInit==0 );

  pBt = pPage->pBt;
  data = pPage->aData + pPage->hdrOffset;
  /* EVIDENCE-OF: R-28594-02890 The one-byte flag at offset 0 indicating
  ** the b-tree page type. */
  if( decodeFlags(pPage, data[0]) ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( pBt->pageSize>=512 && pBt->pageSize<=65536 );
  pPage->maskPage = (u16)(pBt->pageSize - 1);
  pPage->nOverflow = 0;
  pPage->cellOffset = pPage->hdrOffset + 8 + pPage->childPtrSize;
  pPage->aCellIdx = data + pPage->childPtrSize + 8;
  pPage->aDataEnd = pPage->aData + pBt->usableSize;
  pPage->aDataOfst = pPage->aData + pPage->childPtrSize;
  /* EVIDENCE-OF: R-37002-32774 The two-byte integer at offset 3 gives the
  ** number of cells on the page. */
  pPage->nCell = get2byte(&data[3]);
  if( pPage->nCell>MX_CELL(pBt) ){
    /* To many cells for a single page.  The page must be corrupt */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  testcase( pPage->nCell==MX_CELL(pBt) );
  /* EVIDENCE-OF: R-24089-57979 If a page contains no cells (which is only
  ** possible for a root page of a table that contains no rows) then the
  ** offset to the cell content area will equal the page size minus the
  ** bytes of reserved space. */
  assert( pPage->nCell>0
       || get2byteNotZero(&data[5])==(int)pBt->usableSize
       || CORRUPT_DB );
  pPage->nFree = -1;  /* Indicate that this value is yet uncomputed */
  pPage->isInit = 1;
  if( pBt->db->flags & SQLITE_CellSizeCk ){
    return btreeCellSizeCheck(pPage);
  }
  return SQLITE_OK;
}